

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_statistics.cpp
# Opt level: O2

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::ParquetStatisticsUtils::CreateNumericStats
          (ParquetStatisticsUtils *this,LogicalType *type,ParquetColumnSchema *schema_ele,
          Statistics *parquet_stats)

{
  Value VStack_1b8;
  LogicalType local_178;
  LogicalType local_160;
  LogicalType local_148;
  LogicalType local_130;
  LogicalType local_118;
  Value max;
  Value min;
  BaseStatistics stats;
  
  LogicalType::LogicalType(&local_118,type);
  NumericStats::CreateUnknown(&stats,&local_118);
  LogicalType::~LogicalType(&local_118);
  LogicalType::LogicalType(&local_130,SQLNULL);
  Value::Value(&min,&local_130);
  LogicalType::~LogicalType(&local_130);
  LogicalType::LogicalType(&local_148,SQLNULL);
  Value::Value(&max,&local_148);
  LogicalType::~LogicalType(&local_148);
  if (((byte)parquet_stats->__isset & 0x20) == 0) {
    if (((byte)parquet_stats->__isset & 2) != 0) {
      ConvertValue(&VStack_1b8,type,schema_ele,&parquet_stats->min);
      goto LAB_01ec1d7e;
    }
    LogicalType::LogicalType(&local_160,type);
    Value::Value(&VStack_1b8,&local_160);
    Value::operator=(&min,&VStack_1b8);
    Value::~Value(&VStack_1b8);
    LogicalType::~LogicalType(&local_160);
  }
  else {
    ConvertValue(&VStack_1b8,type,schema_ele,&parquet_stats->min_value);
LAB_01ec1d7e:
    Value::operator=(&min,&VStack_1b8);
    Value::~Value(&VStack_1b8);
  }
  if (((byte)parquet_stats->__isset & 0x10) == 0) {
    if (((byte)parquet_stats->__isset & 1) == 0) {
      LogicalType::LogicalType(&local_178,type);
      Value::Value(&VStack_1b8,&local_178);
      Value::operator=(&max,&VStack_1b8);
      Value::~Value(&VStack_1b8);
      LogicalType::~LogicalType(&local_178);
      goto LAB_01ec1e30;
    }
    ConvertValue(&VStack_1b8,type,schema_ele,&parquet_stats->max);
  }
  else {
    ConvertValue(&VStack_1b8,type,schema_ele,&parquet_stats->max_value);
  }
  Value::operator=(&max,&VStack_1b8);
  Value::~Value(&VStack_1b8);
LAB_01ec1e30:
  NumericStats::SetMin(&stats,&min);
  NumericStats::SetMax(&stats,&max);
  BaseStatistics::ToUnique((BaseStatistics *)this);
  Value::~Value(&max);
  Value::~Value(&min);
  BaseStatistics::~BaseStatistics(&stats);
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

unique_ptr<BaseStatistics> ParquetStatisticsUtils::CreateNumericStats(const LogicalType &type,
                                                                      const ParquetColumnSchema &schema_ele,
                                                                      const duckdb_parquet::Statistics &parquet_stats) {
	auto stats = NumericStats::CreateUnknown(type);

	// for reasons unknown to science, Parquet defines *both* `min` and `min_value` as well as `max` and
	// `max_value`. All are optional. such elegance.
	Value min;
	Value max;
	if (parquet_stats.__isset.min_value) {
		min = ParquetStatisticsUtils::ConvertValue(type, schema_ele, parquet_stats.min_value);
	} else if (parquet_stats.__isset.min) {
		min = ParquetStatisticsUtils::ConvertValue(type, schema_ele, parquet_stats.min);
	} else {
		min = Value(type);
	}
	if (parquet_stats.__isset.max_value) {
		max = ParquetStatisticsUtils::ConvertValue(type, schema_ele, parquet_stats.max_value);
	} else if (parquet_stats.__isset.max) {
		max = ParquetStatisticsUtils::ConvertValue(type, schema_ele, parquet_stats.max);
	} else {
		max = Value(type);
	}
	NumericStats::SetMin(stats, min);
	NumericStats::SetMax(stats, max);
	return stats.ToUnique();
}